

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  stbi_uc sVar12;
  uint uVar13;
  stbi_uc *psVar14;
  int iVar15;
  long lVar16;
  char *zout;
  int iVar17;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar2 = a->zbuffer;
    pbVar3 = a->zbuffer_end;
    uVar11 = 0;
    uVar6 = 0;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar6 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar11 = (uint)*pbVar2;
    }
    if ((((pbVar3 <= a->zbuffer) || (0x8421084 < (uVar6 << 8 | uVar11) * -0x42108421)) ||
        ((uVar11 & 0x20) != 0)) || ((uVar6 & 0xf) != 8)) {
LAB_001aaa60:
      *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_001aaa72:
      return 0;
    }
  }
  a->num_bits = 0;
  a->hit_zeof_once = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  do {
    iVar7 = 0x1cd3d0;
    if (a->num_bits < 1) {
      stbi__fill_bits(a);
    }
    iVar9 = a->num_bits;
    uVar6 = a->code_buffer;
    a->code_buffer = uVar6 >> 1;
    a->num_bits = iVar9 + -1;
    if (iVar9 < 3) {
      stbi__fill_bits(a);
    }
    iVar9 = a->num_bits;
    uVar11 = a->code_buffer;
    a->code_buffer = uVar11 >> 2;
    uVar13 = iVar9 - 2;
    a->num_bits = uVar13;
    switch(uVar11 & 3) {
    case 0:
      uVar13 = uVar13 & 7;
      if (uVar13 != 0) {
        stbi__zreceive(a,uVar13);
      }
      iVar7 = a->num_bits;
      if (iVar7 < 1) {
        uVar10 = 0;
      }
      else {
        uVar11 = a->code_buffer;
        uVar10 = 0;
        iVar9 = iVar7;
        do {
          *(char *)((long)local_814.fast + uVar10) = (char)uVar11;
          uVar10 = uVar10 + 1;
          uVar11 = uVar11 >> 8;
          iVar7 = iVar9 + -8;
          bVar5 = 8 < iVar9;
          iVar9 = iVar7;
        } while (bVar5);
        a->code_buffer = uVar11;
        a->num_bits = iVar7;
      }
      if (-1 < iVar7) {
        if ((uint)uVar10 < 4) {
          psVar14 = a->zbuffer;
          psVar4 = a->zbuffer_end;
          uVar10 = uVar10 & 0xffffffff;
          do {
            if (psVar14 < psVar4) {
              a->zbuffer = psVar14 + 1;
              sVar12 = *psVar14;
              psVar14 = psVar14 + 1;
            }
            else {
              sVar12 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar10) = sVar12;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 4);
        }
        if (((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) &&
           (uVar10 = (ulong)local_814.fast[0], a->zbuffer + uVar10 <= a->zbuffer_end)) {
          if ((a->zout_end < a->zout + uVar10) &&
             (iVar7 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar7 == 0)) {
            return 0;
          }
          memcpy(a->zout,a->zbuffer,uVar10);
          a->zbuffer = a->zbuffer + uVar10;
          a->zout = a->zout + uVar10;
          goto LAB_001aaa4e;
        }
      }
      goto LAB_001aaa60;
    case 1:
      iVar9 = stbi__zbuild_huffman
                        (z,
                         "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x120);
      if (iVar9 == 0) {
        return 0;
      }
      psVar14 = 
      "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
      ;
      iVar15 = 0x20;
      break;
    case 2:
      if (iVar9 < 7) {
        stbi__fill_bits(a);
      }
      iVar7 = a->num_bits;
      uVar11 = a->code_buffer;
      a->code_buffer = uVar11 >> 5;
      a->num_bits = iVar7 + -5;
      if (iVar7 < 10) {
        stbi__fill_bits(a);
      }
      iVar7 = a->num_bits;
      uVar13 = a->code_buffer;
      a->code_buffer = uVar13 >> 5;
      a->num_bits = iVar7 + -5;
      if (iVar7 < 9) {
        stbi__fill_bits(a);
      }
      uVar11 = uVar11 & 0x1f;
      iVar9 = uVar11 + 0x101;
      iVar15 = (uVar13 & 0x1f) + 1;
      uVar13 = a->code_buffer;
      a->code_buffer = uVar13 >> 4;
      a->num_bits = a->num_bits + -4;
      local_a08[0] = 0;
      local_a08[1] = 0;
      local_a08[2] = 0;
      local_a08[3] = 0;
      local_a08[4] = 0;
      local_a08[5] = 0;
      local_a08[6] = 0;
      local_a08[7] = 0;
      local_a08[8] = 0;
      local_a08[9] = 0;
      local_a08[10] = 0;
      local_a08[0xb] = 0;
      local_a08[0xc] = 0;
      local_a08[0xd] = 0;
      local_a08[0xe] = 0;
      local_a08[0xf] = 0;
      local_a08[0x10] = 0;
      local_a08[0x11] = 0;
      local_a08[0x12] = 0;
      lVar16 = 0;
      do {
        if (a->num_bits < 3) {
          stbi__fill_bits(a);
        }
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 3;
        a->num_bits = a->num_bits + -3;
        local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[lVar16]] = (byte)uVar8 & 7;
        lVar16 = lVar16 + 1;
      } while ((ulong)(uVar13 & 0xf) + 4 != lVar16);
      iVar7 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
      if (iVar7 == 0) {
        return 0;
      }
      iVar17 = iVar15 + iVar9;
      iVar7 = 0;
      while( true ) {
        if (iVar17 <= iVar7) break;
        uVar13 = stbi__zhuffman_decode(a,&local_814);
        if (uVar13 < 0x13) {
          if ((int)uVar13 < 0x10) {
            lVar16 = (long)iVar7;
            iVar7 = iVar7 + 1;
            abStack_9e9[lVar16 + 1] = (char)uVar13;
            bVar5 = true;
          }
          else {
            iVar1 = a->num_bits;
            if (uVar13 == 0x11) {
              if (iVar1 < 3) {
                stbi__fill_bits(a);
              }
              uVar13 = a->code_buffer;
              a->code_buffer = uVar13 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar13 = (uVar13 & 7) + 3;
LAB_001aa752:
              uVar8 = 0;
LAB_001aa754:
              if ((int)uVar13 <= iVar17 - iVar7) {
                memset(abStack_9e9 + (long)iVar7 + 1,uVar8,(ulong)uVar13);
                iVar7 = iVar7 + uVar13;
                bVar5 = true;
                goto LAB_001aa7a5;
              }
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
            }
            else {
              if (uVar13 != 0x10) {
                if (iVar1 < 7) {
                  stbi__fill_bits(a);
                }
                uVar13 = a->code_buffer;
                a->code_buffer = uVar13 >> 7;
                a->num_bits = a->num_bits + -7;
                uVar13 = (uVar13 & 0x7f) + 0xb;
                goto LAB_001aa752;
              }
              if (iVar1 < 2) {
                stbi__fill_bits(a);
              }
              uVar13 = a->code_buffer;
              a->code_buffer = uVar13 >> 2;
              a->num_bits = a->num_bits + -2;
              if (iVar7 != 0) {
                uVar13 = (uVar13 & 3) + 3;
                uVar8 = (uint)abStack_9e9[iVar7];
                goto LAB_001aa754;
              }
              *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
              iVar7 = 0;
            }
            bVar5 = false;
          }
        }
        else {
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
          bVar5 = false;
        }
LAB_001aa7a5:
        if (!bVar5) {
          return 0;
        }
      }
      if (iVar17 != iVar7) goto LAB_001aaa60;
      iVar9 = stbi__zbuild_huffman(z,(stbi_uc *)((long)abStack_9e9 + 1),iVar9);
      if (iVar9 == 0) {
        return 0;
      }
      psVar14 = asStack_8e7 + uVar11;
      break;
    case 3:
      goto LAB_001aaa72;
    }
    iVar9 = stbi__zbuild_huffman(&a->z_distance,psVar14,iVar15);
    if (iVar9 == 0) {
      return 0;
    }
    zout = a->zout;
    do {
      iVar9 = stbi__zhuffman_decode(a,z);
      if (iVar9 < 0x100) {
        if (iVar9 < 0) {
LAB_001aa905:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_001aa917:
          bVar5 = false;
          iVar7 = 0;
        }
        else {
          if (a->zout_end <= zout) {
            iVar15 = stbi__zexpand(a,zout,1);
            if (iVar15 == 0) goto LAB_001aa917;
            zout = a->zout;
          }
          *zout = (char)iVar9;
          zout = zout + 1;
          bVar5 = true;
        }
      }
      else {
        if (iVar9 != 0x100) {
          if (iVar9 < 0x11e) {
            uVar10 = (ulong)(iVar9 - 0x101);
            uVar11 = stbi__zlength_base[uVar10];
            if (0xffffffffffffffeb < uVar10 - 0x1c) {
              uVar13 = stbi__zreceive(a,stbi__zlength_extra[uVar10]);
              uVar11 = uVar11 + uVar13;
            }
            uVar13 = stbi__zhuffman_decode(a,&a->z_distance);
            if (uVar13 < 0x1e) {
              uVar10 = (ulong)uVar13;
              iVar9 = stbi__zdist_base[uVar10];
              if (0xffffffffffffffe5 < uVar10 - 0x1e) {
                uVar13 = stbi__zreceive(a,stbi__zdist_extra[uVar10]);
                iVar9 = iVar9 + uVar13;
              }
              if ((long)iVar9 <= (long)zout - (long)a->zout_start) {
                if ((long)a->zout_end - (long)zout < (long)(int)uVar11) {
                  iVar15 = stbi__zexpand(a,zout,uVar11);
                  if (iVar15 == 0) goto LAB_001aa917;
                  zout = a->zout;
                }
                lVar16 = -(long)iVar9;
                if (iVar9 == 1) {
                  bVar5 = true;
                  if (uVar11 != 0) {
                    memset(zout,(uint)(byte)zout[lVar16],(ulong)uVar11);
                    zout = zout + (ulong)(uVar11 - 1) + 1;
                  }
                }
                else {
                  bVar5 = true;
                  for (; uVar11 != 0; uVar11 = uVar11 - 1) {
                    *zout = zout[lVar16];
                    zout = zout + 1;
                  }
                }
                goto LAB_001aa91a;
              }
            }
          }
          goto LAB_001aa905;
        }
        a->zout = zout;
        iVar7 = 1;
        if (a->hit_zeof_once == 0) {
          bVar5 = false;
        }
        else {
          bVar5 = false;
          if (a->num_bits < 0x10) {
            *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
            goto LAB_001aa917;
          }
        }
      }
LAB_001aa91a:
    } while (bVar5);
    if (iVar7 == 0) {
      return 0;
    }
LAB_001aaa4e:
    if ((uVar6 & 1) != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}